

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRotUtils.h
# Opt level: O1

ChVector<double> *
chrono::fea::rotutils::VecRot(ChVector<double> *__return_storage_ptr__,ChMatrix33<double> *Phi)

{
  double __x;
  double dVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ChMatrix33<double> eet;
  double a;
  ChMatrix33<double> local_a0;
  double local_58;
  ChVector<double> local_50;
  ChMatrix33<double> *local_38;
  ChMatrix33<double> *local_30;
  
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[2] = 0.0;
  __x = ((Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] +
         (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] +
         (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] +
        -1.0) * 0.5;
  if (__x <= 0.0) {
    local_50.m_data[2] = 0.5;
    local_38 = Phi;
    local_30 = Phi;
    ChMatrix33<double>::
    ChMatrix33<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,1,3,3>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,1,3,3>const,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>const>const>const>>
              (&local_a0,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_const_Eigen::Transpose<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>_>
                *)&local_50);
    dVar5 = local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] -
            __x;
    local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = dVar5;
    local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] -
         __x;
    local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] -
         __x;
    bVar3 = dVar5 < local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[4];
    if (bVar3) {
      dVar5 = local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
      ;
      local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
           local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
      local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    }
    uVar4 = (uint)bVar3;
    dVar1 = local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    dVar2 = local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    if (local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
        [(ulong)uVar4 * 4] <
        local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]) {
      uVar4 = 2;
      dVar5 = local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
      ;
      dVar1 = local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
      ;
      dVar2 = local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
      ;
    }
    dVar6 = (1.0 - __x) *
            local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
            [(ulong)uVar4 * 4];
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar6;
      auVar8 = vsqrtsd_avx(auVar8,auVar8);
      dVar6 = auVar8._0_8_;
    }
    dVar6 = 1.0 / dVar6;
    dVar1 = dVar1 * dVar6;
    dVar2 = dVar2 * dVar6;
    dVar5 = dVar5 * dVar6;
    __return_storage_ptr__->m_data[0] = dVar5;
    __return_storage_ptr__->m_data[1] = dVar2;
    __return_storage_ptr__->m_data[2] = dVar1;
    local_58 = atan2(((Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[0] * 0.0 +
                      (dVar2 * (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[6] -
                      dVar1 * (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                              .m_data.array[3]) +
                     dVar1 * (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[1] +
                     ((Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[4] * 0.0 -
                     dVar5 * (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[7]) +
                     ((dVar5 * (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
                               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                               m_storage.m_data.array[5] +
                      (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                      array[8] * 0.0) -
                     dVar2 * (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array[2])) * -0.5,__x);
  }
  else {
    dVar5 = ((Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3]
            - (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
            ) * 0.5;
    dVar1 = ((Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
            - (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
            ) * 0.5;
    dVar2 = ((Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7]
            - (Phi->super_Matrix<double,_3,_3,_1,_3,_3>).
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
            ) * 0.5;
    __return_storage_ptr__->m_data[0] = dVar2;
    __return_storage_ptr__->m_data[1] = dVar1;
    __return_storage_ptr__->m_data[2] = dVar5;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar1 * dVar1;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = dVar2;
    auVar8 = vfmadd231sd_fma(auVar7,auVar10,auVar10);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = dVar5;
    auVar8 = vfmadd231sd_fma(auVar8,auVar9,auVar9);
    if (auVar8._0_8_ < 0.0) {
      dVar5 = sqrt(auVar8._0_8_);
    }
    else {
      auVar8 = vsqrtsd_avx(auVar8,auVar8);
      dVar5 = auVar8._0_8_;
    }
    local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         atan2(dVar5,__x);
    local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    local_50.m_data[1] = 0.0;
    local_50.m_data[2] = 0.0;
    local_50.m_data[0] =
         local_a0.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    RotCo<chrono::ChVector<double>,double>(1,(ChVector<double> *)&local_a0,&local_50,&local_58);
    local_58 = 1.0 / local_58;
  }
  __return_storage_ptr__->m_data[0] = local_58 * __return_storage_ptr__->m_data[0];
  __return_storage_ptr__->m_data[1] = local_58 * __return_storage_ptr__->m_data[1];
  __return_storage_ptr__->m_data[2] = local_58 * __return_storage_ptr__->m_data[2];
  return __return_storage_ptr__;
}

Assistant:

ChVector<> VecRot(const ChMatrix33<>& Phi) {
    double a, cosphi, sinphi;
    ChVector<> unit;

    cosphi = (Phi.trace() - 1.) / 2.;
    if (cosphi > 0.) {
        unit = Phi.GetAx();
        sinphi = unit.Length();
        double phi = atan2(sinphi, cosphi);
        CoeffA(ChVector<>(phi, 0., 0.), ChVector<>(phi, 0., 0.), &a);
        unit /= a;
    } else {
        // -1 <= cosphi <= 0
        ChMatrix33<> eet = 0.5 * (Phi + Phi.transpose());
        eet(0, 0) -= cosphi;
        eet(1, 1) -= cosphi;
        eet(2, 2) -= cosphi;
        int maxcol = 0;
        ChVector<> col = eet.Get_A_Xaxis();
        if (eet(1, 1) > eet(0, 0)) {
            maxcol = 1;
            col = eet.Get_A_Yaxis();
        }
        if (eet(2, 2) > eet(maxcol, maxcol)) {
            maxcol = 2;
            col = eet.Get_A_Zaxis();
        }
        unit = (col / sqrt(eet(maxcol, maxcol) * (1. - cosphi)));
        ChStarMatrix33<> unitx(unit);
        sinphi = -(unitx * Phi).trace() / 2.;
        unit *= atan2(sinphi, cosphi);
    }
    return unit;
}